

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigTest.cpp
# Opt level: O1

void __thiscall jaegertracing::Config_testParse_Test::TestBody(Config_testParse_Test *this)

{
  char cVar1;
  element_type *peVar2;
  AssertionResult gtest_ar;
  Config config;
  long *local_378;
  AssertHelper local_370 [8];
  Node local_368;
  Config local_348;
  Config local_1a8;
  
  YAML::Load(&local_368.m_isValid);
  Config::parse(&local_348,&local_368);
  if (local_368.m_pMemory.
      super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_368.m_pMemory.
               super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  testing::internal::CmpHelperEQ<char[14],std::__cxx11::string>
            ((internal *)&local_368,"\"probabilistic\"","config.sampler().type()",
             (char (*) [14])"probabilistic",&local_348._sampler._type);
  if (local_368.m_isValid == false) {
    testing::Message::Message((Message *)&local_378);
    if (local_368.m_pMemory.
        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      peVar2 = (element_type *)0x1fd4e1;
    }
    else {
      peVar2 = ((local_368.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->m_pMemory).super___shared_ptr<YAML::detail::memory,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_370,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/ConfigTest.cpp"
               ,0x38,(char *)peVar2);
    testing::internal::AssertHelper::operator=(local_370,(Message *)&local_378);
    testing::internal::AssertHelper::~AssertHelper(local_370);
    if (local_378 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_378 != (long *)0x0)) {
        (**(code **)(*local_378 + 8))();
      }
      local_378 = (long *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_368.m_pMemory,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_368.m_pMemory,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
              ((internal *)&local_368,"\"debug-id\"","config.headers().jaegerDebugHeader()",
               (char (*) [9])0x1edcbe,&local_348._headers._jaegerDebugHeader);
    if (local_368.m_isValid == false) {
      testing::Message::Message((Message *)&local_378);
      if (local_368.m_pMemory.
          super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        peVar2 = (element_type *)0x1fd4e1;
      }
      else {
        peVar2 = ((local_368.m_pMemory.
                   super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->m_pMemory).
                 super___shared_ptr<YAML::detail::memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      testing::internal::AssertHelper::AssertHelper
                (local_370,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/ConfigTest.cpp"
                 ,0x39,(char *)peVar2);
      testing::internal::AssertHelper::operator=(local_370,(Message *)&local_378);
      testing::internal::AssertHelper::~AssertHelper(local_370);
      if (local_378 != (long *)0x0) {
        cVar1 = testing::internal::IsTrue(true);
        if ((cVar1 != '\0') && (local_378 != (long *)0x0)) {
          (**(code **)(*local_378 + 8))();
        }
        local_378 = (long *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_368.m_pMemory,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_368.m_pMemory,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
                ((internal *)&local_368,"\"baggage\"","config.headers().jaegerBaggageHeader()",
                 (char (*) [8])0x1edcce,&local_348._headers._jaegerBaggageHeader);
      if (local_368.m_isValid == false) {
        testing::Message::Message((Message *)&local_378);
        if (local_368.m_pMemory.
            super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          peVar2 = (element_type *)0x1fd4e1;
        }
        else {
          peVar2 = ((local_368.m_pMemory.
                     super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_pMemory).
                   super___shared_ptr<YAML::detail::memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        }
        testing::internal::AssertHelper::AssertHelper
                  (local_370,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/ConfigTest.cpp"
                   ,0x3a,(char *)peVar2);
        testing::internal::AssertHelper::operator=(local_370,(Message *)&local_378);
        testing::internal::AssertHelper::~AssertHelper(local_370);
        if (local_378 != (long *)0x0) {
          cVar1 = testing::internal::IsTrue(true);
          if ((cVar1 != '\0') && (local_378 != (long *)0x0)) {
            (**(code **)(*local_378 + 8))();
          }
          local_378 = (long *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_368.m_pMemory,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_368.m_pMemory,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
                  ((internal *)&local_368,"\"trace-id\"","config.headers().traceContextHeaderName()"
                   ,(char (*) [9])0x1edcdb,&local_348._headers._traceContextHeaderName);
        if (local_368.m_isValid != false) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_368.m_pMemory,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
                    ((internal *)&local_368,"\"testctx-\"",
                     "config.headers().traceBaggageHeaderPrefix()",(char (*) [9])"testctx-",
                     &local_348._headers._traceBaggageHeaderPrefix);
          if (local_368.m_isValid == false) {
            testing::Message::Message((Message *)&local_378);
            if (local_368.m_pMemory.
                super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                == (element_type *)0x0) {
              peVar2 = (element_type *)0x1fd4e1;
            }
            else {
              peVar2 = ((local_368.m_pMemory.
                         super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_pMemory).
                       super___shared_ptr<YAML::detail::memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            }
            testing::internal::AssertHelper::AssertHelper
                      (local_370,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/ConfigTest.cpp"
                       ,0x3c,(char *)peVar2);
            testing::internal::AssertHelper::operator=(local_370,(Message *)&local_378);
            testing::internal::AssertHelper::~AssertHelper(local_370);
            if (local_378 != (long *)0x0) {
              cVar1 = testing::internal::IsTrue(true);
              if ((cVar1 != '\0') && (local_378 != (long *)0x0)) {
                (**(code **)(*local_378 + 8))();
              }
              local_378 = (long *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_368.m_pMemory,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          Config::~Config(&local_348);
          if (local_368.m_isValid == false) {
            return;
          }
          YAML::Load(&local_348._disabled);
          Config::parse(&local_1a8,(Node *)&local_348);
          Config::~Config(&local_1a8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_348._serviceName._M_string_length ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            return;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_348._serviceName._M_string_length);
          return;
        }
        testing::Message::Message((Message *)&local_378);
        if (local_368.m_pMemory.
            super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          peVar2 = (element_type *)0x1fd4e1;
        }
        else {
          peVar2 = ((local_368.m_pMemory.
                     super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_pMemory).
                   super___shared_ptr<YAML::detail::memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        }
        testing::internal::AssertHelper::AssertHelper
                  (local_370,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/ConfigTest.cpp"
                   ,0x3b,(char *)peVar2);
        testing::internal::AssertHelper::operator=(local_370,(Message *)&local_378);
        testing::internal::AssertHelper::~AssertHelper(local_370);
        if (local_378 != (long *)0x0) {
          cVar1 = testing::internal::IsTrue(true);
          if ((cVar1 != '\0') && (local_378 != (long *)0x0)) {
            (**(code **)(*local_378 + 8))();
          }
          local_378 = (long *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_368.m_pMemory,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
  }
  Config::~Config(&local_348);
  return;
}

Assistant:

TEST(Config, testParse)
{
    {
        constexpr auto kConfigYAML = R"cfg(
disabled: true
traceid_128bit: true
sampler:
    type: probabilistic
    param: 0.001
reporter:
    queueSize: 100
    bufferFlushInterval: 10
    logSpans: false
    localAgentHostPort: 127.0.0.1:6831
headers:
    jaegerDebugHeader: debug-id
    jaegerBaggageHeader: baggage
    TraceContextHeaderName: trace-id
    traceBaggageHeaderPrefix: "testctx-"
baggage_restrictions:
    denyBaggageOnInitializationFailure: false
    hostPort: 127.0.0.1:5778
    refreshInterval: 60
)cfg";
        const auto config = Config::parse(YAML::Load(kConfigYAML));
        ASSERT_EQ("probabilistic", config.sampler().type());
        ASSERT_EQ("debug-id", config.headers().jaegerDebugHeader());
        ASSERT_EQ("baggage", config.headers().jaegerBaggageHeader());
        ASSERT_EQ("trace-id", config.headers().traceContextHeaderName());
        ASSERT_EQ("testctx-", config.headers().traceBaggageHeaderPrefix());
    }

    {
        Config::parse(YAML::Load(R"cfg(
disabled: false
traceid_128bit: false
sampler: 1
reporter: 2
headers: 3
baggage_restrictions: 4
)cfg"));
    }
}